

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

EndsWithMatcher *
Catch::Matchers::EndsWith
          (EndsWithMatcher *__return_storage_ptr__,string *str,Choice caseSensitivity)

{
  undefined1 local_40 [40];
  
  StdString::CasedString::CasedString((CasedString *)local_40,str,caseSensitivity);
  StdString::EndsWithMatcher::EndsWithMatcher(__return_storage_ptr__,(CasedString *)local_40);
  std::__cxx11::string::~string((string *)(local_40 + 8));
  return __return_storage_ptr__;
}

Assistant:

StdString::EndsWithMatcher EndsWith(std::string const& str, CaseSensitive::Choice caseSensitivity) {
            return StdString::EndsWithMatcher(StdString::CasedString(str, caseSensitivity));
        }